

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
::find_non_soo<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  bool bVar37;
  ushort uVar38;
  ctrl_t *pcVar39;
  ulong uVar40;
  ulong uVar41;
  anon_union_8_1_a8a14541_for_iterator_2 unaff_R13;
  uint uVar42;
  ulong uVar43;
  undefined4 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i match;
  undefined1 auVar47 [16];
  iterator iVar48;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_&>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  uVar41 = hash >> 7 ^ uVar3 >> 0xc;
  auVar45 = ZEXT416((CONCAT11((char)hash,(char)hash) & 0xff7f) & 0xffff7fff);
  auVar45 = pshuflw(auVar45,auVar45,0);
  uVar44 = auVar45._0_4_;
  auVar45._4_4_ = uVar44;
  auVar45._0_4_ = uVar44;
  auVar45._8_4_ = uVar44;
  auVar45._12_4_ = uVar44;
  uVar40 = 0;
  do {
    uVar41 = uVar41 & uVar2;
    pcVar1 = (char *)(uVar3 + uVar41);
    auVar46[0] = -(auVar45[0] == *pcVar1);
    auVar46[1] = -(auVar45[1] == pcVar1[1]);
    auVar46[2] = -(auVar45[2] == pcVar1[2]);
    auVar46[3] = -(auVar45[3] == pcVar1[3]);
    auVar46[4] = -(auVar45[4] == pcVar1[4]);
    auVar46[5] = -(auVar45[5] == pcVar1[5]);
    auVar46[6] = -(auVar45[6] == pcVar1[6]);
    auVar46[7] = -(auVar45[7] == pcVar1[7]);
    auVar46[8] = -(auVar45[8] == pcVar1[8]);
    auVar46[9] = -(auVar45[9] == pcVar1[9]);
    auVar46[10] = -(auVar45[10] == pcVar1[10]);
    auVar46[0xb] = -(auVar45[0xb] == pcVar1[0xb]);
    auVar46[0xc] = -(auVar45[0xc] == pcVar1[0xc]);
    auVar46[0xd] = -(auVar45[0xd] == pcVar1[0xd]);
    auVar46[0xe] = -(auVar45[0xe] == pcVar1[0xe]);
    auVar46[0xf] = -(auVar45[0xf] == pcVar1[0xf]);
    uVar38 = (ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe | (ushort)(auVar46[0xf] >> 7) << 0xf;
    uVar42 = (uint)uVar38;
    cVar21 = *pcVar1;
    cVar22 = pcVar1[1];
    cVar23 = pcVar1[2];
    cVar24 = pcVar1[3];
    cVar25 = pcVar1[4];
    cVar26 = pcVar1[5];
    cVar27 = pcVar1[6];
    cVar28 = pcVar1[7];
    cVar29 = pcVar1[8];
    cVar30 = pcVar1[9];
    cVar31 = pcVar1[10];
    cVar32 = pcVar1[0xb];
    cVar33 = pcVar1[0xc];
    cVar34 = pcVar1[0xd];
    cVar35 = pcVar1[0xe];
    cVar36 = pcVar1[0xf];
    cVar5 = local_58;
    cVar6 = cStack_57;
    cVar7 = cStack_56;
    cVar8 = cStack_55;
    cVar9 = cStack_54;
    cVar10 = cStack_53;
    cVar11 = cStack_52;
    cVar12 = cStack_51;
    cVar13 = cStack_50;
    cVar14 = cStack_4f;
    cVar15 = cStack_4e;
    cVar16 = cStack_4d;
    cVar17 = cStack_4c;
    cVar18 = cStack_4b;
    cVar19 = cStack_4a;
    cVar20 = cStack_49;
    while (cStack_49 = cVar36, cStack_4a = cVar35, cStack_4b = cVar34, cStack_4c = cVar33,
          cStack_4d = cVar32, cStack_4e = cVar31, cStack_4f = cVar30, cStack_50 = cVar29,
          cStack_51 = cVar28, cStack_52 = cVar27, cStack_53 = cVar26, cStack_54 = cVar25,
          cStack_55 = cVar24, cStack_56 = cVar23, cStack_57 = cVar22, local_58 = cVar21, uVar38 != 0
          ) {
      uVar4 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar43 = uVar4 + uVar41 & uVar2;
      unaff_R13.slot_ = (slot_type *)(uVar43 * 5);
      local_68.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + uVar43 * 0x28);
      local_68.second.
      super__Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_&>
      .
      super__Head_base<0UL,_const_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_&>
            )(*(long *)(this + 0x18) + uVar43 * 0x28 + 0x20);
      local_78.rhs = key;
      local_78.eq = (key_equal *)this;
      local_48 = auVar45;
      bVar37 = memory_internal::
               DecomposePairImpl<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>const&>>
                         (&local_78,&local_68);
      if (bVar37) {
        if (*(long *)(this + 0x10) == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9ef,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>]"
                       );
        }
        pcVar39 = (ctrl_t *)(*(long *)(this + 0x10) + uVar43);
        unaff_R13.slot_ = (slot_type *)(uVar43 * 0x28 + *(long *)(this + 0x18));
        goto LAB_002452d5;
      }
      uVar38 = (ushort)(uVar42 - 1) & (ushort)uVar42;
      uVar42 = CONCAT22((short)(uVar42 - 1 >> 0x10),uVar38);
      auVar45 = local_48;
      cVar21 = local_58;
      cVar22 = cStack_57;
      cVar23 = cStack_56;
      cVar24 = cStack_55;
      cVar25 = cStack_54;
      cVar26 = cStack_53;
      cVar27 = cStack_52;
      cVar28 = cStack_51;
      cVar29 = cStack_50;
      cVar30 = cStack_4f;
      cVar31 = cStack_4e;
      cVar32 = cStack_4d;
      cVar33 = cStack_4c;
      cVar34 = cStack_4b;
      cVar35 = cStack_4a;
      cVar36 = cStack_49;
      cVar5 = local_58;
      cVar6 = cStack_57;
      cVar7 = cStack_56;
      cVar8 = cStack_55;
      cVar9 = cStack_54;
      cVar10 = cStack_53;
      cVar11 = cStack_52;
      cVar12 = cStack_51;
      cVar13 = cStack_50;
      cVar14 = cStack_4f;
      cVar15 = cStack_4e;
      cVar16 = cStack_4d;
      cVar17 = cStack_4c;
      cVar18 = cStack_4b;
      cVar19 = cStack_4a;
      cVar20 = cStack_49;
    }
    auVar47[0] = -(local_58 == -0x80);
    auVar47[1] = -(cStack_57 == -0x80);
    auVar47[2] = -(cStack_56 == -0x80);
    auVar47[3] = -(cStack_55 == -0x80);
    auVar47[4] = -(cStack_54 == -0x80);
    auVar47[5] = -(cStack_53 == -0x80);
    auVar47[6] = -(cStack_52 == -0x80);
    auVar47[7] = -(cStack_51 == -0x80);
    auVar47[8] = -(cStack_50 == -0x80);
    auVar47[9] = -(cStack_4f == -0x80);
    auVar47[10] = -(cStack_4e == -0x80);
    auVar47[0xb] = -(cStack_4d == -0x80);
    auVar47[0xc] = -(cStack_4c == -0x80);
    auVar47[0xd] = -(cStack_4b == -0x80);
    auVar47[0xe] = -(cStack_4a == -0x80);
    auVar47[0xf] = -(cStack_49 == -0x80);
    local_58 = cVar5;
    cStack_57 = cVar6;
    cStack_56 = cVar7;
    cStack_55 = cVar8;
    cStack_54 = cVar9;
    cStack_53 = cVar10;
    cStack_52 = cVar11;
    cStack_51 = cVar12;
    cStack_50 = cVar13;
    cStack_4f = cVar14;
    cStack_4e = cVar15;
    cStack_4d = cVar16;
    cStack_4c = cVar17;
    cStack_4b = cVar18;
    cStack_4a = cVar19;
    if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_49 == -0x80) {
      cStack_49 = cVar20;
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                  *)this);
      pcVar39 = (ctrl_t *)0x0;
LAB_002452d5:
      iVar48.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)unaff_R13.slot_;
      iVar48.ctrl_ = pcVar39;
      return iVar48;
    }
    uVar41 = uVar41 + uVar40 + 0x10;
    uVar40 = uVar40 + 0x10;
    cStack_49 = cVar20;
    if (*(ulong *)this < uVar40) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::FeatureSet>>>, K = std::basic_string<char>]"
                   );
    }
  } while( true );
}

Assistant:

size_t capacity() const { return capacity_; }